

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_dump.h
# Opt level: O0

void LatencyDumpDefaultImpl::dumpRecursive(stringstream *ss,DumpItem *dump_item,size_t max_name_len)

{
  bool bVar1;
  DumpItem *in_RDX;
  stringstream *in_RSI;
  long in_RDI;
  DumpItem *child;
  unique_ptr<LatencyDumpDefaultImpl::DumpItem,_std::default_delete<LatencyDumpDefaultImpl::DumpItem>_>
  *entry;
  iterator __end1;
  iterator __begin1;
  list<std::unique_ptr<LatencyDumpDefaultImpl::DumpItem,_std::default_delete<LatencyDumpDefaultImpl::DumpItem>_>,_std::allocator<std::unique_ptr<LatencyDumpDefaultImpl::DumpItem,_std::default_delete<LatencyDumpDefaultImpl::DumpItem>_>_>_>
  *__range1;
  bool in_stack_00000327;
  uint64_t in_stack_00000328;
  size_t in_stack_00000330;
  LatencyItem *in_stack_00000338;
  list<std::unique_ptr<LatencyDumpDefaultImpl::DumpItem,_std::default_delete<LatencyDumpDefaultImpl::DumpItem>_>,_std::allocator<std::unique_ptr<LatencyDumpDefaultImpl::DumpItem,_std::default_delete<LatencyDumpDefaultImpl::DumpItem>_>_>_>
  *in_stack_ffffffffffffff38;
  ostream *in_stack_ffffffffffffff40;
  _Self local_80;
  _Self local_78;
  stringstream *local_70;
  string local_68 [48];
  string local_38 [24];
  size_t in_stack_ffffffffffffffe0;
  
  if (*(long *)(in_RSI + 8) != 0) {
    if (*(long *)(in_RSI + 0x10) == 0) {
      in_stack_ffffffffffffff40 = (ostream *)(in_RDI + 0x10);
      dumpItem_abi_cxx11_(in_stack_00000338,in_stack_00000330,in_stack_00000328,in_stack_00000327);
      std::operator<<(in_stack_ffffffffffffff40,local_68);
      std::__cxx11::string::~string(local_68);
    }
    else {
      LatencyItem::getTotalTime((LatencyItem *)0x10f5cd);
      dumpItem_abi_cxx11_(in_stack_00000338,in_stack_00000330,in_stack_00000328,in_stack_00000327);
      std::operator<<((ostream *)(in_RDI + 0x10),local_38);
      std::__cxx11::string::~string(local_38);
    }
    std::ostream::operator<<((ostream *)(in_RDI + 0x10),std::endl<char,std::char_traits<char>>);
  }
  local_70 = in_RSI + 0x18;
  local_78._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::unique_ptr<LatencyDumpDefaultImpl::DumpItem,_std::default_delete<LatencyDumpDefaultImpl::DumpItem>_>,_std::allocator<std::unique_ptr<LatencyDumpDefaultImpl::DumpItem,_std::default_delete<LatencyDumpDefaultImpl::DumpItem>_>_>_>
       ::begin(in_stack_ffffffffffffff38);
  local_80._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::unique_ptr<LatencyDumpDefaultImpl::DumpItem,_std::default_delete<LatencyDumpDefaultImpl::DumpItem>_>,_std::allocator<std::unique_ptr<LatencyDumpDefaultImpl::DumpItem,_std::default_delete<LatencyDumpDefaultImpl::DumpItem>_>_>_>
       ::end(in_stack_ffffffffffffff38);
  while( true ) {
    bVar1 = std::operator!=(&local_78,&local_80);
    if (!bVar1) break;
    std::
    _List_iterator<std::unique_ptr<LatencyDumpDefaultImpl::DumpItem,_std::default_delete<LatencyDumpDefaultImpl::DumpItem>_>_>
    ::operator*((_List_iterator<std::unique_ptr<LatencyDumpDefaultImpl::DumpItem,_std::default_delete<LatencyDumpDefaultImpl::DumpItem>_>_>
                 *)0x10f71f);
    std::
    unique_ptr<LatencyDumpDefaultImpl::DumpItem,_std::default_delete<LatencyDumpDefaultImpl::DumpItem>_>
    ::get((unique_ptr<LatencyDumpDefaultImpl::DumpItem,_std::default_delete<LatencyDumpDefaultImpl::DumpItem>_>
           *)in_stack_ffffffffffffff40);
    dumpRecursive(in_RSI,in_RDX,in_stack_ffffffffffffffe0);
    std::
    _List_iterator<std::unique_ptr<LatencyDumpDefaultImpl::DumpItem,_std::default_delete<LatencyDumpDefaultImpl::DumpItem>_>_>
    ::operator++(&local_78);
  }
  return;
}

Assistant:

static void dumpRecursive(std::stringstream& ss,
                              DumpItem* dump_item,
                              size_t max_name_len) {
        if (dump_item->itself) {
            if (dump_item->parent) {
                ss << dumpItem(dump_item->itself, max_name_len,
                               dump_item->parent->getTotalTime());
            } else {
                ss << dumpItem(dump_item->itself, max_name_len);
            }
            ss << std::endl;
        }
        for (auto& entry : dump_item->child) {
            DumpItem* child = entry.get();
            dumpRecursive(ss, child, max_name_len);
        }
    }